

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O3

streamsize __thiscall
xe::xml::EscapeStreambuf::xsputn(EscapeStreambuf *this,char *s,streamsize count)

{
  char *__s;
  ulong uVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  if (count < 1) {
    lVar4 = 0;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      uVar1 = (ulong)(byte)s[lVar3];
      if ((uVar1 < 0x3f) && ((0x500000c4ffffd9ffU >> (uVar1 & 0x3f) & 1) != 0)) {
        __s = (&PTR_anon_var_dwarf_580f7_00128a48)[uVar1];
        poVar2 = this->m_dst;
        if (lVar4 < lVar3) {
          std::ostream::write((char *)poVar2,(long)(s + lVar4));
          poVar2 = this->m_dst;
          if (((byte)poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0x20] & 5) != 0) {
            return lVar4;
          }
        }
        strlen(__s);
        std::ostream::write((char *)poVar2,(long)__s);
        lVar4 = lVar3 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != count);
  }
  if ((count <= lVar4) ||
     (std::ostream::write((char *)this->m_dst,(long)(s + lVar4)),
     ((byte)this->m_dst[*(long *)(*(long *)this->m_dst + -0x18) + 0x20] & 5) == 0)) {
    lVar4 = count;
  }
  return lVar4;
}

Assistant:

std::streamsize EscapeStreambuf::xsputn (const char* s, std::streamsize count)
{
	std::streamsize	numWritten = 0;

	for (std::streamsize inPos = 0; inPos < count; inPos++)
	{
		const char* entity = getEscapeEntity(s[inPos]);

		if (entity)
		{
			// Flush data prior to entity.
			if (inPos > numWritten)
			{
				m_dst.write(s + numWritten, inPos-numWritten);
				if (m_dst.fail())
					return numWritten;
			}

			// Flush entity value
			m_dst.write(entity, (std::streamsize)strlen(entity));

			numWritten = inPos+1;
		}
	}

	if (numWritten < count)
	{
		m_dst.write(s + numWritten, count-numWritten);
		if (m_dst.fail())
			return numWritten;
	}

	return count;
}